

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u16 selFlags,
                         Expr *pLimit,Expr *pOffset)

{
  Expr *in_RCX;
  SrcList *in_RDX;
  ExprList *in_RSI;
  sqlite3 *in_RDI;
  ExprList *in_R8;
  Expr *in_R9;
  ExprList *in_stack_00000008;
  sqlite3 *db;
  Select standin;
  Select *pNew;
  u64 in_stack_ffffffffffffff38;
  sqlite3 *in_stack_ffffffffffffff40;
  sqlite3_vfs *p;
  sqlite3 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  sqlite3 *in_stack_ffffffffffffff60;
  Select *local_38;
  SrcList *local_18;
  ExprList *local_10;
  
  p = in_RDI->pVfs;
  local_38 = (Select *)sqlite3DbMallocZero(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (local_38 == (Select *)0x0) {
    local_38 = (Select *)&stack0xffffffffffffff50;
    memset(local_38,0,0x78);
  }
  local_10 = in_RSI;
  if (in_RSI == (ExprList *)0x0) {
    sqlite3Expr(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                (char *)in_stack_ffffffffffffff50);
    local_10 = sqlite3ExprListAppend
                         ((Parse *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (ExprList *)in_stack_ffffffffffffff50,(Expr *)p);
    in_stack_ffffffffffffff40 = in_RDI;
  }
  local_38->pEList = local_10;
  local_18 = in_RDX;
  if (in_RDX == (SrcList *)0x0) {
    local_18 = (SrcList *)sqlite3DbMallocZero(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  local_38->pSrc = local_18;
  local_38->pWhere = in_RCX;
  local_38->pGroupBy = in_R8;
  local_38->pHaving = in_R9;
  local_38->pOrderBy = in_stack_00000008;
  local_38->selFlags = (u16)db;
  local_38->op = 'w';
  local_38->pLimit = (Expr *)standin.pEList;
  local_38->pOffset = (Expr *)standin._8_8_;
  local_38->addrOpenEphm[0] = -1;
  local_38->addrOpenEphm[1] = -1;
  if (*(char *)((long)&p->xDlError + 1) != '\0') {
    clearSelect(in_stack_ffffffffffffff50,(Select *)p,
                (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    local_38 = (Select *)0x0;
  }
  return local_38;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u16 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit,         /* LIMIT value.  NULL means not used */
  Expr *pOffset         /* OFFSET value.  NULL means no offset */
){
  Select *pNew;
  Select standin;
  sqlite3 *db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  assert( db->mallocFailed || !pOffset || pLimit ); /* OFFSET implies LIMIT */
  if( pNew==0 ){
    assert( db->mallocFailed );
    pNew = &standin;
    memset(pNew, 0, sizeof(*pNew));
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db,TK_ALL,0));
  }
  pNew->pEList = pEList;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->selFlags = selFlags;
  pNew->op = TK_SELECT;
  pNew->pLimit = pLimit;
  pNew->pOffset = pOffset;
  assert( pOffset==0 || pLimit!=0 );
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  if( db->mallocFailed ) {
    clearSelect(db, pNew, pNew!=&standin);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}